

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O0

vx_aabb_t * vx__aabb_merge(vx_aabb_t *__return_storage_ptr__,vx_aabb_t *a,vx_aabb_t *b)

{
  float *pfVar1;
  float fVar2;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  vx_aabb_t *b_local;
  vx_aabb_t *a_local;
  
  fVar2 = (a->min).field_0.v[0];
  if (fVar2 < (b->min).field_0.v[0] || fVar2 == (b->min).field_0.v[0]) {
    local_2c = (a->min).field_0.v[0];
  }
  else {
    local_2c = (b->min).field_0.v[0];
  }
  (__return_storage_ptr__->min).field_0.v[0] = local_2c;
  fVar2 = (a->min).field_0.v[1];
  pfVar1 = (b->min).field_0.v + 1;
  if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
    local_30 = (a->min).field_0.v[1];
  }
  else {
    local_30 = (b->min).field_0.v[1];
  }
  (__return_storage_ptr__->min).field_0.v[1] = local_30;
  fVar2 = (a->min).field_0.v[2];
  pfVar1 = (b->min).field_0.v + 2;
  if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
    local_34 = (a->min).field_0.v[2];
  }
  else {
    local_34 = (b->min).field_0.v[2];
  }
  (__return_storage_ptr__->min).field_0.v[2] = local_34;
  fVar2 = (a->max).field_0.v[0];
  if (fVar2 < (b->max).field_0.v[0] || fVar2 == (b->max).field_0.v[0]) {
    local_38 = (b->max).field_0.v[0];
  }
  else {
    local_38 = (a->max).field_0.v[0];
  }
  (__return_storage_ptr__->max).field_0.v[0] = local_38;
  fVar2 = (a->max).field_0.v[1];
  pfVar1 = (b->max).field_0.v + 1;
  if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
    local_3c = (b->max).field_0.v[1];
  }
  else {
    local_3c = (a->max).field_0.v[1];
  }
  (__return_storage_ptr__->max).field_0.v[1] = local_3c;
  fVar2 = (a->max).field_0.v[2];
  pfVar1 = (b->max).field_0.v + 2;
  if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
    local_40 = (b->max).field_0.v[2];
  }
  else {
    local_40 = (a->max).field_0.v[2];
  }
  (__return_storage_ptr__->max).field_0.v[2] = local_40;
  return __return_storage_ptr__;
}

Assistant:

vx_aabb_t vx__aabb_merge(vx_aabb_t* a, vx_aabb_t* b)
{
    vx_aabb_t merge;

    merge.min.x = VX_MIN(a->min.x, b->min.x);
    merge.min.y = VX_MIN(a->min.y, b->min.y);
    merge.min.z = VX_MIN(a->min.z, b->min.z);

    merge.max.x = VX_MAX(a->max.x, b->max.x);
    merge.max.y = VX_MAX(a->max.y, b->max.y);
    merge.max.z = VX_MAX(a->max.z, b->max.z);

    return merge;
}